

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void convertARGBFromARGB32PM_sse4<false,true>(uint *buffer,uint *src,int count)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  QRgb QVar19;
  undefined1 (*pauVar20) [16];
  ulong *puVar21;
  undefined8 *puVar22;
  int in_EDX;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  long in_RDI;
  long in_FS_OFFSET;
  uint uVar23;
  float fVar24;
  undefined8 extraout_XMM0_Qb;
  float fVar25;
  float in_XMM2_Da;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  __m128 afVar28;
  uint v_1;
  int _i;
  __m128i srcVectorAlphaMask;
  __m128 ia4;
  __m128 ia3;
  __m128 ia2;
  __m128 ia1;
  __m128i src4;
  __m128i src2;
  __m128i src3;
  __m128i src1;
  __m128 ia;
  __m128 a;
  __m128i srcVectorAlpha;
  __m128i srcVector;
  __m128i zero;
  __m128i rgbaMask;
  __m128i alphaMask;
  uint v;
  int i;
  QRgb in_stack_fffffffffffffa90;
  QRgb in_stack_fffffffffffffab8;
  int local_53c;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  float local_4a8;
  float fStack_4a4;
  int local_430;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  byte local_308;
  byte bStack_307;
  byte bStack_306;
  byte bStack_305;
  byte bStack_304;
  byte bStack_303;
  byte bStack_302;
  byte bStack_301;
  byte bStack_2e0;
  byte bStack_2df;
  byte bStack_2de;
  byte bStack_2dd;
  byte bStack_2dc;
  byte bStack_2db;
  byte bStack_2da;
  byte bStack_2d9;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint uStack_1f4;
  uint uStack_1ec;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint uStack_1d4;
  uint uStack_1cc;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_430 = 0;
  if ((MXCSR & 0x80) == 0) {
    for (; local_430 < in_EDX; local_430 = local_430 + 1) {
      QVar19 = qUnpremultiply(in_stack_fffffffffffffa90);
      *(QRgb *)(in_RDI + (long)local_430 * 4) = QVar19 | 0xff000000;
    }
  }
  else {
    for (; local_430 < in_EDX + -3; local_430 = local_430 + 4) {
      pauVar20 = (undefined1 (*) [16])(CONCAT71(in_register_00000031,in_SIL) + (long)local_430 * 4);
      uVar3 = *(undefined8 *)*pauVar20;
      uVar14 = *(undefined8 *)(*pauVar20 + 8);
      auVar26._8_8_ = 0xff000000ff000000;
      auVar26._0_8_ = 0xff000000ff000000;
      if ((auVar26 & *pauVar20) == (undefined1  [16])0x0) {
        puVar22 = (undefined8 *)(in_RDI + (long)local_430 * 4);
        *puVar22 = 0xff000000ff000000;
        puVar22[1] = 0xff000000ff000000;
      }
      else {
        auVar27._8_8_ = 0xff000000ff000000;
        auVar27._0_8_ = 0xff000000ff000000;
        if ((auVar27 & ~*pauVar20) == (undefined1  [16])0x0) {
          if (in_RDI != CONCAT71(in_register_00000031,in_SIL)) {
            puVar22 = (undefined8 *)(in_RDI + (long)local_430 * 4);
            *puVar22 = uVar3;
            puVar22[1] = uVar14;
          }
        }
        else {
          local_208 = (uint)uVar3;
          uStack_200 = (uint)uVar14;
          uVar23 = (uint)((ulong)uVar3 >> 0x38);
          afVar28[1] = (float)uVar23;
          afVar28[0] = (float)(local_208 >> 0x18);
          afVar28[2] = 255.0;
          afVar28[3] = 0.0;
          afVar28 = reciprocal_mul_ps(afVar28,in_XMM2_Da);
          fVar24 = (float)extraout_XMM0_Qb;
          fVar25 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
          local_308 = (byte)uVar3;
          bStack_307 = (byte)((ulong)uVar3 >> 8);
          bStack_306 = (byte)((ulong)uVar3 >> 0x10);
          bStack_305 = (byte)((ulong)uVar3 >> 0x18);
          bStack_304 = (byte)((ulong)uVar3 >> 0x20);
          bStack_303 = (byte)((ulong)uVar3 >> 0x28);
          bStack_302 = (byte)((ulong)uVar3 >> 0x30);
          bStack_301 = (byte)((ulong)uVar3 >> 0x38);
          bStack_2e0 = (byte)uVar14;
          bStack_2df = (byte)((ulong)uVar14 >> 8);
          bStack_2de = (byte)((ulong)uVar14 >> 0x10);
          bStack_2dd = (byte)((ulong)uVar14 >> 0x18);
          bStack_2dc = (byte)((ulong)uVar14 >> 0x20);
          bStack_2db = (byte)((ulong)uVar14 >> 0x28);
          bStack_2da = (byte)((ulong)uVar14 >> 0x30);
          bStack_2d9 = (byte)((ulong)uVar14 >> 0x38);
          uStack_4d0._0_4_ = (uint)bStack_302;
          uStack_4e0._0_4_ = (uint)bStack_2da;
          local_4a8 = afVar28[0];
          fStack_4a4 = afVar28[1];
          uStack_1c4 = (uint)bStack_307;
          uStack_1c0 = (uint)bStack_306;
          uStack_1bc = (uint)bStack_305;
          fVar11 = (float)uStack_1c4;
          fVar12 = (float)uStack_1c0;
          fVar13 = (float)uStack_1bc;
          uVar3 = CONCAT17((char)((uint)fVar11 >> 0x18),
                           CONCAT16((char)((uint)fVar11 >> 0x10),
                                    CONCAT15((char)((uint)fVar11 >> 8),
                                             CONCAT14(SUB41(fVar11,0),(float)local_308))));
          auVar4[8] = SUB41(fVar12,0);
          auVar4._0_8_ = uVar3;
          auVar4[9] = (char)((uint)fVar12 >> 8);
          auVar4[10] = (char)((uint)fVar12 >> 0x10);
          auVar4[0xb] = (char)((uint)fVar12 >> 0x18);
          auVar2[0xc] = SUB41(fVar13,0);
          auVar2._0_12_ = auVar4;
          auVar2[0xd] = (char)((uint)fVar13 >> 8);
          auVar2[0xe] = (char)((uint)fVar13 >> 0x10);
          auVar2[0xf] = (char)((uint)fVar13 >> 0x18);
          fStack_3a4 = (float)((ulong)uVar3 >> 0x20);
          fStack_3a0 = auVar4._8_4_;
          fStack_39c = auVar2._12_4_;
          local_4b8 = CONCAT44((int)(fStack_3a4 * local_4a8),(int)((float)local_308 * local_4a8));
          uStack_4b0._0_4_ = (int)(fStack_3a0 * local_4a8);
          uStack_4b0._4_4_ = (int)(fStack_39c * local_4a8);
          uStack_1d4 = (uint)bStack_303;
          uStack_1cc = (uint)bStack_301;
          fVar11 = (float)uStack_1d4;
          fVar12 = (float)(uint)uStack_4d0;
          fVar13 = (float)uStack_1cc;
          uVar3 = CONCAT17((char)((uint)fVar11 >> 0x18),
                           CONCAT16((char)((uint)fVar11 >> 0x10),
                                    CONCAT15((char)((uint)fVar11 >> 8),
                                             CONCAT14(SUB41(fVar11,0),(float)bStack_304))));
          auVar6[8] = SUB41(fVar12,0);
          auVar6._0_8_ = uVar3;
          auVar6[9] = (char)((uint)fVar12 >> 8);
          auVar6[10] = (char)((uint)fVar12 >> 0x10);
          auVar6[0xb] = (char)((uint)fVar12 >> 0x18);
          auVar5[0xc] = SUB41(fVar13,0);
          auVar5._0_12_ = auVar6;
          auVar5[0xd] = (char)((uint)fVar13 >> 8);
          auVar5[0xe] = (char)((uint)fVar13 >> 0x10);
          auVar5[0xf] = (char)((uint)fVar13 >> 0x18);
          fStack_3c4 = (float)((ulong)uVar3 >> 0x20);
          fStack_3c0 = auVar6._8_4_;
          fStack_3bc = auVar5._12_4_;
          local_4d8 = CONCAT44((int)(fStack_3c4 * fStack_4a4),(int)((float)bStack_304 * fStack_4a4))
          ;
          uStack_4d0 = CONCAT44((int)(fStack_3bc * fStack_4a4),(int)(fStack_3c0 * fStack_4a4));
          uStack_1e4 = (uint)bStack_2df;
          uStack_1e0 = (uint)bStack_2de;
          uStack_1dc = (uint)bStack_2dd;
          fVar11 = (float)uStack_1e4;
          fVar12 = (float)uStack_1e0;
          fVar13 = (float)uStack_1dc;
          uVar3 = CONCAT17((char)((uint)fVar11 >> 0x18),
                           CONCAT16((char)((uint)fVar11 >> 0x10),
                                    CONCAT15((char)((uint)fVar11 >> 8),
                                             CONCAT14(SUB41(fVar11,0),(float)bStack_2e0))));
          auVar8[8] = SUB41(fVar12,0);
          auVar8._0_8_ = uVar3;
          auVar8[9] = (char)((uint)fVar12 >> 8);
          auVar8[10] = (char)((uint)fVar12 >> 0x10);
          auVar8[0xb] = (char)((uint)fVar12 >> 0x18);
          auVar7[0xc] = SUB41(fVar13,0);
          auVar7._0_12_ = auVar8;
          auVar7[0xd] = (char)((uint)fVar13 >> 8);
          auVar7[0xe] = (char)((uint)fVar13 >> 0x10);
          auVar7[0xf] = (char)((uint)fVar13 >> 0x18);
          fStack_3e4 = (float)((ulong)uVar3 >> 0x20);
          fStack_3e0 = auVar8._8_4_;
          fStack_3dc = auVar7._12_4_;
          local_4c8 = CONCAT44((int)(fStack_3e4 * fVar24),(int)((float)bStack_2e0 * fVar24));
          uStack_4c0._0_4_ = (int)(fStack_3e0 * fVar24);
          uStack_4c0._4_4_ = (int)(fStack_3dc * fVar24);
          uStack_1f4 = (uint)bStack_2db;
          uStack_1ec = (uint)bStack_2d9;
          fVar11 = (float)uStack_1f4;
          fVar12 = (float)(uint)uStack_4e0;
          fVar13 = (float)uStack_1ec;
          uVar3 = CONCAT17((char)((uint)fVar11 >> 0x18),
                           CONCAT16((char)((uint)fVar11 >> 0x10),
                                    CONCAT15((char)((uint)fVar11 >> 8),
                                             CONCAT14(SUB41(fVar11,0),(float)bStack_2dc))));
          auVar10[8] = SUB41(fVar12,0);
          auVar10._0_8_ = uVar3;
          auVar10[9] = (char)((uint)fVar12 >> 8);
          auVar10[10] = (char)((uint)fVar12 >> 0x10);
          auVar10[0xb] = (char)((uint)fVar12 >> 0x18);
          auVar9[0xc] = SUB41(fVar13,0);
          auVar9._0_12_ = auVar10;
          auVar9[0xd] = (char)((uint)fVar13 >> 8);
          auVar9[0xe] = (char)((uint)fVar13 >> 0x10);
          auVar9[0xf] = (char)((uint)fVar13 >> 0x18);
          fStack_404 = (float)((ulong)uVar3 >> 0x20);
          fStack_400 = auVar10._8_4_;
          fStack_3fc = auVar9._12_4_;
          local_4e8 = CONCAT44((int)(fStack_404 * fVar25),(int)((float)bStack_2dc * fVar25));
          uStack_4e0 = CONCAT44((int)(fStack_3fc * fVar25),(int)(fStack_400 * fVar25));
          auVar18._8_8_ = uStack_4b0;
          auVar18._0_8_ = local_4b8;
          auVar17._8_8_ = uStack_4d0;
          auVar17._0_8_ = local_4d8;
          auVar26 = packusdw(auVar18,auVar17);
          auVar16._8_8_ = uStack_4c0;
          auVar16._0_8_ = local_4c8;
          auVar15._8_8_ = uStack_4e0;
          auVar15._0_8_ = local_4e8;
          auVar27 = packusdw(auVar16,auVar15);
          local_2c8 = auVar26._0_2_;
          sStack_2c6 = auVar26._2_2_;
          sStack_2c4 = auVar26._4_2_;
          sStack_2c2 = auVar26._6_2_;
          sStack_2c0 = auVar26._8_2_;
          sStack_2be = auVar26._10_2_;
          sStack_2bc = auVar26._12_2_;
          sStack_2ba = auVar26._14_2_;
          local_2d8 = auVar27._0_2_;
          sStack_2d6 = auVar27._2_2_;
          sStack_2d4 = auVar27._4_2_;
          sStack_2d2 = auVar27._6_2_;
          sStack_2d0 = auVar27._8_2_;
          sStack_2ce = auVar27._10_2_;
          sStack_2cc = auVar27._12_2_;
          sStack_2ca = auVar27._14_2_;
          local_4b8._0_2_ =
               CONCAT11((0 < sStack_2c6) * (sStack_2c6 < 0x100) * auVar26[2] - (0xff < sStack_2c6),
                        (0 < local_2c8) * (local_2c8 < 0x100) * auVar26[0] - (0xff < local_2c8));
          local_4b8._0_3_ =
               CONCAT12((0 < sStack_2c4) * (sStack_2c4 < 0x100) * auVar26[4] - (0xff < sStack_2c4),
                        (undefined2)local_4b8);
          local_4b8._0_4_ =
               CONCAT13((0 < sStack_2c2) * (sStack_2c2 < 0x100) * auVar26[6] - (0xff < sStack_2c2),
                        (undefined3)local_4b8);
          local_4b8._0_5_ =
               CONCAT14((0 < sStack_2c0) * (sStack_2c0 < 0x100) * auVar26[8] - (0xff < sStack_2c0),
                        (undefined4)local_4b8);
          local_4b8._0_6_ =
               CONCAT15((0 < sStack_2be) * (sStack_2be < 0x100) * auVar26[10] - (0xff < sStack_2be),
                        (undefined5)local_4b8);
          local_4b8._0_7_ =
               CONCAT16((0 < sStack_2bc) * (sStack_2bc < 0x100) * auVar26[0xc] - (0xff < sStack_2bc)
                        ,(undefined6)local_4b8);
          local_4b8 = CONCAT17((0 < sStack_2ba) * (sStack_2ba < 0x100) * auVar26[0xe] -
                               (0xff < sStack_2ba),(undefined7)local_4b8);
          uStack_4b0._0_1_ = (0 < local_2d8) * (local_2d8 < 0x100) * auVar27[0] - (0xff < local_2d8)
          ;
          uStack_4b0._1_1_ =
               (0 < sStack_2d6) * (sStack_2d6 < 0x100) * auVar27[2] - (0xff < sStack_2d6);
          uStack_4b0._2_1_ =
               (0 < sStack_2d4) * (sStack_2d4 < 0x100) * auVar27[4] - (0xff < sStack_2d4);
          uStack_4b0._3_1_ =
               (0 < sStack_2d2) * (sStack_2d2 < 0x100) * auVar27[6] - (0xff < sStack_2d2);
          uStack_4b0._4_1_ =
               (0 < sStack_2d0) * (sStack_2d0 < 0x100) * auVar27[8] - (0xff < sStack_2d0);
          uStack_4b0._5_1_ =
               (0 < sStack_2ce) * (sStack_2ce < 0x100) * auVar27[10] - (0xff < sStack_2ce);
          uStack_4b0._6_1_ =
               (0 < sStack_2cc) * (sStack_2cc < 0x100) * auVar27[0xc] - (0xff < sStack_2cc);
          uStack_4b0._7_1_ =
               (0 < sStack_2ca) * (sStack_2ca < 0x100) * auVar27[0xe] - (0xff < sStack_2ca);
          in_XMM2_Da = (float)-(uint)(local_208 >> 0x18 == 0);
          puVar21 = (ulong *)(in_RDI + (long)local_430 * 4);
          *puVar21 = (CONCAT44(-(uint)(uVar23 == 0),in_XMM2_Da) ^ 0xffffffffffffffff) & local_4b8 |
                     0xff000000ff000000;
          puVar21[1] = (CONCAT44(-(uint)((uint)((ulong)uVar14 >> 0x38) == 0),
                                 -(uint)(uStack_200 >> 0x18 == 0)) ^ 0xffffffffffffffff) &
                       uStack_4b0 | 0xff000000ff000000;
        }
      }
    }
    for (local_53c = 0; local_53c < 3 && local_430 < in_EDX; local_53c = local_53c + 1) {
      QVar19 = qUnpremultiply_sse4(in_stack_fffffffffffffab8);
      *(QRgb *)(in_RDI + (long)local_430 * 4) = QVar19 | 0xff000000;
      local_430 = local_430 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void convertARGBFromARGB32PM_sse4(uint *buffer, const uint *src, int count)
{
    int i = 0;
    if ((_MM_GET_EXCEPTION_MASK() & _MM_MASK_INVALID) == 0) {
        for (; i < count; ++i) {
            uint v = qUnpremultiply(src[i]);
            if (RGBx)
                v = 0xff000000 | v;
            if (RGBA)
                v = ARGB2RGBA(v);
            buffer[i] = v;
        }
        return;
    }
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            if (!_mm_testc_si128(srcVector, alphaMask)) {
                __m128i srcVectorAlpha = _mm_srli_epi32(srcVector, 24);
                if (RGBA)
                    srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
                const __m128 a = _mm_cvtepi32_ps(srcVectorAlpha);
                const __m128 ia = reciprocal_mul_ps(a, 255.0f);
                __m128i src1 = _mm_unpacklo_epi8(srcVector, zero);
                __m128i src3 = _mm_unpackhi_epi8(srcVector, zero);
                __m128i src2 = _mm_unpackhi_epi16(src1, zero);
                __m128i src4 = _mm_unpackhi_epi16(src3, zero);
                src1 = _mm_unpacklo_epi16(src1, zero);
                src3 = _mm_unpacklo_epi16(src3, zero);
                __m128 ia1 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(0, 0, 0, 0));
                __m128 ia2 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(1, 1, 1, 1));
                __m128 ia3 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(2, 2, 2, 2));
                __m128 ia4 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(3, 3, 3, 3));
                src1 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src1), ia1));
                src2 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src2), ia2));
                src3 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src3), ia3));
                src4 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src4), ia4));
                src1 = _mm_packus_epi32(src1, src2);
                src3 = _mm_packus_epi32(src3, src4);
                src1 = _mm_packus_epi16(src1, src3);
                // Handle potential alpha == 0 values:
                __m128i srcVectorAlphaMask = _mm_cmpeq_epi32(srcVectorAlpha, zero);
                src1 = _mm_andnot_si128(srcVectorAlphaMask, src1);
                // Fixup alpha values:
                if (RGBx)
                    srcVector = _mm_or_si128(src1, alphaMask);
                else
                    srcVector = _mm_blendv_epi8(src1, srcVector, alphaMask);
                _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            } else {
                if (RGBA)
                    _mm_storeu_si128((__m128i *)&buffer[i], _mm_shuffle_epi8(srcVector, rgbaMask));
                else if (buffer != src)
                    _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            }
        } else {
            if (RGBx)
                _mm_storeu_si128((__m128i *)&buffer[i], alphaMask);
            else
                _mm_storeu_si128((__m128i *)&buffer[i], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        uint v = qUnpremultiply_sse4(src[i]);
        if (RGBx)
            v = 0xff000000 | v;
        if (RGBA)
            v = ARGB2RGBA(v);
        buffer[i] = v;
    }
}